

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O3

void __thiscall chatra::ArgumentMatcher::ArgumentMatcher(ArgumentMatcher *this)

{
  (this->subArgs).super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subArgs).super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->args).super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subArgs).super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->byName)._M_h._M_buckets = &(this->byName)._M_h._M_single_bucket;
  (this->byName)._M_h._M_bucket_count = 1;
  (this->byName)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->byName)._M_h._M_element_count = 0;
  (this->byName)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->byName)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->byName)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->listCount = 0;
  this->listCountWithoutDefaults = 0;
  *(undefined8 *)((long)&this->listCountWithoutDefaults + 2) = 0;
  *(undefined8 *)((long)&this->dictCountWithoutDefaults + 2) = 0;
  return;
}

Assistant:

ArgumentMatcher::ArgumentMatcher() noexcept {
	listCount = listCountWithoutDefaults = dictCountWithoutDefaults = 0;
	hasListVarArg = hasDictVarArg = false;
}